

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O2

void __thiscall
bssl::gtest_suite_PkitsTest12InhibitAnyPolicy_::
Section12ValidinhibitAnyPolicyTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
::TestBody(Section12ValidinhibitAnyPolicyTest2<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.12.2";
  local_88.should_validate = true;
  PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate>::RunTest<3ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::VerifyCertificateChainPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_28892d_005b8740,(char *(*) [3])&PTR_anon_var_dwarf_28895f_005b8760,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest12InhibitAnyPolicy,
                     Section12ValidinhibitAnyPolicyTest2) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "inhibitAnyPolicy0CACert",
                               "ValidinhibitAnyPolicyTest2EE"};
  const char* const crls[] = {"TrustAnchorRootCRL", "inhibitAnyPolicy0CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.12.2";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}